

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O0

void __thiscall KosarajuSCC::set_levels(KosarajuSCC *this,int start,int sink)

{
  int iVar1;
  allocator_type *__a;
  long in_RDI;
  unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  mand_sccs;
  int in_stack_00000488;
  int in_stack_0000048c;
  KosarajuSCC *in_stack_00000490;
  vector<int,_std::allocator<int>_> *this_00;
  size_type in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  vector<int,_std::allocator<int>_> local_2d;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x2a3da6);
  iVar1 = nb_sccs((KosarajuSCC *)0x2a3db0);
  __a = (allocator_type *)(long)iVar1;
  local_2d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _1_4_ = *(int *)(in_RDI + 8) + 1;
  this_00 = &local_2d;
  std::allocator<int>::allocator((allocator<int> *)0x2a3dd7);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(value_type_conflict *)this_00,__a)
  ;
  std::vector<int,_std::allocator<int>_>::operator=
            (this_00,(vector<int,_std::allocator<int>_> *)__a);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::allocator<int>::~allocator((allocator<int> *)0x2a3e1f);
  std::
  unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::unordered_map((unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                   *)0x2a3e29);
  _set_levels(in_stack_00000490,in_stack_0000048c,in_stack_00000488);
  std::
  unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~unordered_map((unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                    *)0x2a3e4d);
  return;
}

Assistant:

void KosarajuSCC::set_levels(int start, int sink) {
	levels.clear();
	levels = std::vector<int>(nb_sccs(), nb_nodes + 1);
	// bool *visited = new bool[nb_nodes];
	// memset(visited,false , nb_nodes*sizeof(bool));

	const std::unordered_map<int, bool> mand_sccs;
	// levels[scc_of(sink)] = nb_nodes;
	//_set_levels(start,visited,mand_sccs);
	_set_levels(start, sink);
	// delete[] visited;
}